

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::readBuffer
               (Functions *gl,deUint32 target,int numElements,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  GLboolean GVar1;
  GLenum err;
  void *__src;
  TestError *pTVar2;
  size_type __new_size;
  string local_50;
  
  __new_size = (size_type)numElements;
  __src = (*gl->mapBufferRange)(target,0,(long)(__new_size << 0x22) >> 0x20,1);
  err = (*gl->getError)();
  glu::checkError(err,"map",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x51);
  if (__src == (void *)0x0) {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"mapBufferRange returned NULL","");
    tcu::TestError::TestError(pTVar2,&local_50);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(result,__new_size);
  memcpy((result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start,__src,__new_size * 4);
  GVar1 = (*gl->unmapBuffer)(target);
  if (GVar1 != '\0') {
    return;
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"unmapBuffer returned false","");
  tcu::TestError::TestError(pTVar2,&local_50);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void readBuffer (const glw::Functions& gl, deUint32 target, int numElements, std::vector<deUint32>& result)
{
	const void* ptr = gl.mapBufferRange(target, 0, (int)(sizeof(deUint32) * numElements), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "map");

	if (!ptr)
		throw tcu::TestError("mapBufferRange returned NULL");

	result.resize(numElements);
	memcpy(&result[0], ptr, sizeof(deUint32) * numElements);

	if (gl.unmapBuffer(target) == GL_FALSE)
		throw tcu::TestError("unmapBuffer returned false");
}